

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mod2sparse.c
# Opt level: O1

void mod2sparse_mulvec(mod2sparse *m,char *u,char *v)

{
  uint uVar1;
  ulong uVar2;
  mod2entry *pmVar3;
  
  uVar1 = m->n_cols;
  if (0 < (long)m->n_rows) {
    memset(v,0,(long)m->n_rows);
  }
  if (0 < (int)uVar1) {
    uVar2 = 0;
    do {
      if (u[uVar2] != '\0') {
        for (pmVar3 = m->cols[uVar2].down; -1 < pmVar3->row; pmVar3 = pmVar3->down) {
          v[(uint)pmVar3->row] = v[(uint)pmVar3->row] ^ 1;
        }
      }
      uVar2 = uVar2 + 1;
    } while (uVar2 != uVar1);
  }
  return;
}

Assistant:

void mod2sparse_mulvec
( mod2sparse *m,	/* The sparse matrix, with M rows and N columns */
  char *u,		/* The input vector, N long */
  char *v		/* Place to store the result, M long */
)
{
  mod2entry *e;
  int M, N;
  int i, j;

  M = mod2sparse_rows(m);
  N = mod2sparse_cols(m);

  for (i = 0; i<M; i++) v[i] = 0;

  for (j = 0; j<N; j++)
  { if (u[j])
    { for (e = mod2sparse_first_in_col(m,j);
           !mod2sparse_at_end(e);
           e = mod2sparse_next_in_col(e))
      { v[mod2sparse_row(e)] ^= 1;
      }
    }
  }
}